

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refzg.cc
# Opt level: O0

void __thiscall
tchecker::refzg::refzg_t::prev
          (refzg_t *this,const_state_sptr_t *s,incoming_edges_value_t *in_edge,
          vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
          *v,state_status_t mask)

{
  element_type *system;
  state_t *s_00;
  transition_t *t;
  element_type *semantics;
  tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>
  local_68;
  state_status_t local_50 [2];
  state_status_t status;
  undefined1 local_40 [8];
  transition_sptr_t prevt;
  state_sptr_t prevs;
  state_status_t mask_local;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *v_local;
  incoming_edges_value_t *in_edge_local;
  const_state_sptr_t *s_local;
  refzg_t *this_local;
  
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  ::operator*(s);
  details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>::
  clone<>((state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
           *)&prevt,
          (make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)&this->_state_allocator);
  syncprod::details::
  transition_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
  ::construct<>((transition_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
                 *)local_40);
  system = std::
           __shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->_system);
  s_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
          ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
                       *)&prevt)->super_state_t;
  t = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
       ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
                    *)local_40)->super_transition_t;
  semantics = std::
              __shared_ptr_access<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_semantics);
  local_50[0] = refzg::prev(system,s_00,t,semantics,this->_spread,in_edge);
  if ((local_50[0] & mask) != 0) {
    if (this->_sharing_type == SHARING) {
      share(this,(state_sptr_t *)&prevt);
      share(this,(transition_sptr_t *)local_40);
    }
    std::
    make_tuple<unsigned_int&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,unsigned_long,1ul>>&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,unsigned_long,1ul>>&>
              (&local_68,local_50,
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
                *)&prevt,
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
                *)local_40);
    std::
    vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
    ::push_back(v,&local_68);
    std::
    tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>
    ::~tuple(&local_68);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>
              *)local_40);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
              *)&prevt);
  return;
}

Assistant:

void refzg_t::prev(tchecker::refzg::const_state_sptr_t const & s, incoming_edges_value_t const & in_edge,
                   std::vector<sst_t> & v, tchecker::state_status_t mask)
{
  tchecker::refzg::state_sptr_t prevs = _state_allocator.clone(*s);
  tchecker::refzg::transition_sptr_t prevt = _transition_allocator.construct();
  tchecker::state_status_t status = tchecker::refzg::prev(*_system, *prevs, *prevt, *_semantics, _spread, in_edge);
  if (status & mask) {
    if (_sharing_type == tchecker::ts::SHARING) {
      share(prevs);
      share(prevt);
    }
    v.push_back(std::make_tuple(status, prevs, prevt));
  }
}